

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O3

Real Omega_h::get_expected_nelems(Mesh *mesh,Reals *v2m)

{
  int *piVar1;
  uint uVar2;
  Alloc *this;
  Real RVar3;
  double dVar4;
  Reals local_20;
  
  local_20.write_.shared_alloc_.alloc = (v2m->write_).shared_alloc_.alloc;
  if (((ulong)local_20.write_.shared_alloc_.alloc & 7) == 0 &&
      local_20.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_20.write_.shared_alloc_.alloc =
           (Alloc *)((local_20.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_20.write_.shared_alloc_.alloc)->use_count =
           (local_20.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this = local_20.write_.shared_alloc_.alloc;
  local_20.write_.shared_alloc_.direct_ptr = (v2m->write_).shared_alloc_.direct_ptr;
  RVar3 = get_complexity(mesh,&local_20);
  if (((ulong)this & 7) == 0 && this != (Alloc *)0x0) {
    piVar1 = &this->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this);
      operator_delete(this,0x48);
    }
  }
  uVar2 = mesh->dim_;
  if (uVar2 < 4) {
    if (uVar2 == 3) {
      dVar4 = 0.0838934100219;
    }
    else {
      dVar4 = *(double *)(&DAT_0044baf0 + (ulong)(uVar2 == 2) * 8);
    }
    return RVar3 / dVar4;
  }
  fail("assertion %s failed at %s +%d\n","0 <= dim_ && dim_ <= 3",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_mesh.hpp"
       ,0x33);
}

Assistant:

Real get_expected_nelems(Mesh* mesh, Reals v2m) {
  auto complexity = get_complexity(mesh, v2m);
  return get_expected_nelems_from_complexity(complexity, mesh->dim());
}